

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

VTable * vtabDisconnectAll(sqlite3 *db,Table *p)

{
  sqlite3 *psVar1;
  VTable *pVVar2;
  VTable *pVVar3;
  VTable *pVVar4;
  VTable **ppVVar5;
  VTable *pVVar6;
  
  pVVar4 = (p->u).vtab.p;
  (p->u).tab.pDfltList = (ExprList *)0x0;
  pVVar3 = (VTable *)0x0;
  while (pVVar4 != (VTable *)0x0) {
    psVar1 = pVVar4->db;
    if (psVar1 == db) {
      pVVar6 = (VTable *)0x0;
      pVVar3 = pVVar4;
      ppVVar5 = &(p->u).vtab.p;
    }
    else {
      pVVar6 = psVar1->pDisconnect;
      ppVVar5 = &psVar1->pDisconnect;
    }
    pVVar2 = pVVar4->pNext;
    *ppVVar5 = pVVar4;
    pVVar4->pNext = pVVar6;
    pVVar4 = pVVar2;
  }
  return pVVar3;
}

Assistant:

static VTable *vtabDisconnectAll(sqlite3 *db, Table *p){
  VTable *pRet = 0;
  VTable *pVTable;

  assert( IsVirtual(p) );
  pVTable = p->u.vtab.p;
  p->u.vtab.p = 0;

  /* Assert that the mutex (if any) associated with the BtShared database
  ** that contains table p is held by the caller. See header comments
  ** above function sqlite3VtabUnlockList() for an explanation of why
  ** this makes it safe to access the sqlite3.pDisconnect list of any
  ** database connection that may have an entry in the p->u.vtab.p list.
  */
  assert( db==0 || sqlite3SchemaMutexHeld(db, 0, p->pSchema) );

  while( pVTable ){
    sqlite3 *db2 = pVTable->db;
    VTable *pNext = pVTable->pNext;
    assert( db2 );
    if( db2==db ){
      pRet = pVTable;
      p->u.vtab.p = pRet;
      pRet->pNext = 0;
    }else{
      pVTable->pNext = db2->pDisconnect;
      db2->pDisconnect = pVTable;
    }
    pVTable = pNext;
  }

  assert( !db || pRet );
  return pRet;
}